

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertiontests.cpp
# Opt level: O0

void anon_unknown.dwarf_2fa16::assert_range_equals1(void)

{
  initializer_list<long> __l;
  initializer_list<int> __l_00;
  string expected;
  string msg;
  TestFailure *e;
  allocator<long> local_d9;
  long local_d8 [4];
  iterator local_b8;
  size_type local_b0;
  undefined1 local_a8 [8];
  deque<long,_std::allocator<long>_> li;
  allocator<int> local_41;
  int local_40 [4];
  iterator local_30;
  size_type local_28;
  undefined1 local_20 [8];
  vector<int,_std::allocator<int>_> v;
  
  local_40[0] = 0;
  local_40[1] = 1;
  local_40[2] = 2;
  local_40[3] = 3;
  local_30 = local_40;
  local_28 = 4;
  std::allocator<int>::allocator(&local_41);
  __l_00._M_len = local_28;
  __l_00._M_array = local_30;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_20,__l_00,&local_41);
  std::allocator<int>::~allocator(&local_41);
  local_d8[2] = 2;
  local_d8[3] = 4;
  local_d8[0] = 0;
  local_d8[1] = 1;
  local_b8 = local_d8;
  local_b0 = 4;
  std::allocator<long>::allocator(&local_d9);
  __l._M_len = local_b0;
  __l._M_array = local_b8;
  std::deque<long,_std::allocator<long>_>::deque
            ((deque<long,_std::allocator<long>_> *)local_a8,__l,&local_d9);
  std::allocator<long>::~allocator(&local_d9);
  UnitTests::Assert::Assert
            ((Assert *)&e,
             "/workspace/llm4binary/github/license_all_cmakelists_25/john-mullins[P]TestFramework/tests/assertiontests.cpp"
             ,0x174);
  UnitTests::Assert::
  RangeEquals<std::deque<long,std::allocator<long>>&,std::vector<int,std::allocator<int>>&>
            ((Assert *)&e,(deque<long,_std::allocator<long>_> *)local_a8,
             (vector<int,_std::allocator<int>_> *)local_20);
  std::deque<long,_std::allocator<long>_>::~deque((deque<long,_std::allocator<long>_> *)local_a8);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_20);
  return;
}

Assistant:

TEST(assert_range_equals1)
    {
        try
        {
            std::vector<int> v{0, 1, 2, 3};
            std::deque<long> li{0, 1, 2, 4};
            ASSERT_RANGE_EQUALS(li, v);
        }
        catch (UnitTests::TestFailure& e)
        {
            std::string msg = e.what();

            std::string expected = "error A1000: Assertion failure : Expected range [4] different to actual range [4]\n"
                                   "\telement[0] = (0,0)\n"
                                   "\telement[1] = (1,1)\n"
                                   "\telement[2] = (2,2)\n"
                                   "\telement[3] = (4,3) <--------- HERE\n";

            if (msg.find(expected) == std::string::npos)
            {
                throw UnitTests::TestFailure("Unexpected message from ASSERT_RANGE_EQUALS", __FILE__, __LINE__);
            }
        }
    }